

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *
Catch::Detail::parseEnums
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          StringRef enums)

{
  StringRef ref;
  char cVar1;
  long lVar2;
  char in_R8B;
  size_type index;
  StringRef *enumValue;
  pointer pSVar3;
  StringRef str;
  char *pcVar4;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> enumValues;
  StringRef local_40;
  
  str.m_start = (char *)enums.m_size;
  str.m_size = 0x2c;
  splitStringRef(&enumValues,(Catch *)enums.m_start,str,in_R8B);
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::reserve
            (__return_storage_ptr__,
             (long)enumValues.
                   super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)enumValues.
                   super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  pSVar3 = enumValues.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pSVar3 == enumValues.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      clara::std::_Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~_Vector_base
                (&enumValues.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>
                );
      return __return_storage_ptr__;
    }
    pcVar4 = pSVar3->m_start;
    index = pSVar3->m_size;
    lVar2 = -index;
    do {
      index = index - 1;
      if (lVar2 == 0) break;
      cVar1 = StringRef::operator[]((StringRef *)&stack0xffffffffffffff98,index);
      lVar2 = lVar2 + 1;
    } while (cVar1 != ':');
    ref.m_size = (size_type)pcVar4;
    ref.m_start = (char *)0x17cbde;
    local_40 = trim(ref);
    clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
    emplace_back<Catch::StringRef>(__return_storage_ptr__,&local_40);
    pSVar3 = pSVar3 + 1;
  } while( true );
}

Assistant:

std::vector<StringRef> parseEnums( StringRef enums ) {
            auto enumValues = splitStringRef( enums, ',' );
            std::vector<StringRef> parsed;
            parsed.reserve( enumValues.size() );
            for( auto const& enumValue : enumValues ) {
                parsed.push_back(trim(extractInstanceName(enumValue)));
            }
            return parsed;
        }